

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<Data>::resolve<QtPromisePrivate::PromiseValue<Data>const&>
          (PromiseData<Data> *this,PromiseValue<Data> *value)

{
  PromiseValue<Data> local_28;
  PromiseValue<Data> *local_18;
  PromiseValue<Data> *value_local;
  PromiseData<Data> *this_local;
  
  local_18 = value;
  value_local = (PromiseValue<Data> *)this;
  PromiseValue<Data>::PromiseValue(&local_28,value);
  PromiseValue<Data>::operator=(&this->m_value,&local_28);
  PromiseValue<Data>::~PromiseValue(&local_28);
  PromiseDataBase<Data,_void_(const_Data_&)>::setSettled
            (&this->super_PromiseDataBase<Data,_void_(const_Data_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }